

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O0

int Abc_NodeCollapseSuppSize(Abc_Obj_t *pFanin,Abc_Obj_t *pFanout,Vec_Ptr_t *vFanins)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  undefined4 local_2c;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vFanins_local;
  Abc_Obj_t *pFanout_local;
  Abc_Obj_t *pFanin_local;
  
  Vec_PtrClear(vFanins);
  for (local_2c = 0; iVar1 = Abc_ObjFaninNum(pFanout), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar2 = Abc_ObjFanin(pFanout,local_2c);
    if (pAVar2 != pFanin) {
      Vec_PtrPushUnique(vFanins,pAVar2);
    }
  }
  for (local_2c = 0; iVar1 = Abc_ObjFaninNum(pFanin), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar2 = Abc_ObjFanin(pFanin,local_2c);
    Vec_PtrPushUnique(vFanins,pAVar2);
  }
  iVar1 = Vec_PtrSize(vFanins);
  return iVar1;
}

Assistant:

int Abc_NodeCollapseSuppSize( Abc_Obj_t * pFanin, Abc_Obj_t * pFanout, Vec_Ptr_t * vFanins )
{
    Abc_Obj_t * pObj;
    int i;
    Vec_PtrClear( vFanins );
    Abc_ObjForEachFanin( pFanout, pObj, i )
        if ( pObj != pFanin )
            Vec_PtrPushUnique( vFanins, pObj );
    Abc_ObjForEachFanin( pFanin, pObj, i )
        Vec_PtrPushUnique( vFanins, pObj );
    return Vec_PtrSize( vFanins );
}